

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Stress::anon_unknown_0::BlendingCase::testFBO(BlendingCase *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestLog *this_00;
  undefined1 auVar3 [16];
  short sVar4;
  TextureFormat TVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [8];
  undefined1 auVar9 [8];
  int iVar10;
  undefined4 uVar11;
  GLuint uColorLoc;
  deUint32 dVar12;
  void *__s;
  void *__s_00;
  long lVar13;
  short *psVar14;
  undefined4 extraout_var;
  short sVar15;
  long lVar16;
  ulong uVar17;
  ConstPixelBufferAccess *pCVar18;
  int x;
  void *__buf;
  void *__buf_00;
  char *description;
  int z;
  int x_00;
  qpTestResult testResult;
  long lVar19;
  GLenum *pGVar20;
  long lVar21;
  short *psVar22;
  ulong uVar23;
  TestContext *this_01;
  short sVar24;
  short sVar25;
  uint uVar26;
  int y;
  float posX;
  float fVar27;
  float fVar28;
  TextureLevel beforeImage;
  TextureFormat textureFormat;
  Surface errorMask;
  Vec4 cAfter;
  TextureLevel afterImage;
  UVec4 uniformValue;
  Random rnd;
  long local_480;
  void *local_478;
  string local_470;
  ulong local_450;
  void *local_448;
  ulong local_440;
  GLenum *local_438;
  TextureLevel local_430;
  TextureFormat local_408;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  Surface local_360;
  undefined1 local_348 [4];
  float afStack_344 [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  _Alloc_hider local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  TextureLevel local_308;
  undefined1 local_2e0 [8];
  ChannelOrder local_2d8;
  ChannelOrder local_2d4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  _Alloc_hider local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0 [4];
  ios_base local_268 [264];
  undefined1 local_160 [4];
  float afStack_15c [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  _Alloc_hider local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130 [6];
  ConstPixelBufferAccess local_d0;
  ConstPixelBufferAccess local_a8;
  PixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  __s = operator_new(0x2c90);
  memset(__s,0,0x2c90);
  __s_00 = operator_new(0x1ef0);
  memset(__s_00,0,0x1ef0);
  local_408.type =
       (uint)((*(uint *)&(this->super_FramebufferRenderCase).super_RenderCase.field_0x84 &
              0xfffffffe) == 6) << 5 | UNORM_INT8;
  local_408.order = RGBA;
  tcu::TextureLevel::TextureLevel(&local_430,&local_408,0x100,0x100,1);
  tcu::TextureLevel::TextureLevel(&local_308,&local_408,0x100,0x100,1);
  lVar13 = (long)__s + 0xc;
  lVar16 = 0;
  do {
    fVar27 = (float)(int)lVar16 / 22.0;
    lVar21 = 0;
    lVar19 = lVar13;
    do {
      fVar28 = (float)(int)lVar21 / 30.0;
      *(float *)(lVar19 + -0xc) = fVar27 + fVar27 + -1.0;
      *(float *)(lVar19 + -8) = fVar28 + fVar28 + -1.0;
      *(undefined8 *)(lVar19 + -4) = 0x3f80000000000000;
      lVar21 = lVar21 + 1;
      lVar19 = lVar19 + 0x10;
    } while (lVar21 != 0x1f);
    lVar16 = lVar16 + 1;
    lVar13 = lVar13 + 0x1f0;
  } while (lVar16 != 0x17);
  psVar14 = (short *)((long)__s_00 + 10);
  sVar15 = 0;
  lVar13 = 0;
  do {
    lVar16 = -0x1e;
    psVar22 = psVar14;
    do {
      sVar4 = (short)lVar16;
      sVar24 = sVar15 + sVar4 + 0x1e;
      psVar22[-5] = sVar24;
      sVar25 = sVar15 + 0x3e + sVar4;
      psVar22[-4] = sVar25;
      psVar22[-3] = sVar15 + 0x3d + sVar4;
      psVar22[-2] = sVar24;
      psVar22[-1] = sVar25;
      *psVar22 = sVar15 + sVar4 + 0x1f;
      psVar22 = psVar22 + 6;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0);
    lVar13 = lVar13 + 1;
    sVar15 = sVar15 + 0x1f;
    psVar14 = psVar14 + 0xb4;
  } while (lVar13 != 0x16);
  iVar10 = (*((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.m_context)->
             m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar10);
  uVar11 = (**(code **)(lVar13 + 0x780))
                     ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).
                      m_program,"a_pos");
  uColorLoc = (**(code **)(lVar13 + 0xb48))
                        ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->
                         m_program).m_program,"u_special");
  (**(code **)(lVar13 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar13 + 0x188))(0x4000);
  (**(code **)(lVar13 + 0x1a00))(0,0,0x100,0x100);
  (**(code **)(lVar13 + 0x1680))
            ((((this->super_FramebufferRenderCase).super_RenderCase.m_program)->m_program).m_program
            );
  (**(code **)(lVar13 + 0x5e0))(0xbe2);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"pre-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x783);
  (**(code **)(lVar13 + 0x19f0))(uVar11,4,0x1406,0,0,__s);
  (**(code **)(lVar13 + 0x610))(uVar11);
  local_2e0 = (undefined1  [8])
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d8,"Drawing pre-draw pattern.",0x19);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  tcu::TextureLevel::getAccess(&local_58,&local_430);
  drawTestImage(this,&local_58,uColorLoc,0x2c8);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"pre-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x78b);
  (**(code **)(lVar13 + 0x188))(0x4000);
  uVar23 = 0;
  do {
    deRandom_init((deRandom *)local_160,(int)uVar23 * 0x237 + 0x7b);
    local_2e0 = (undefined1  [8])
                ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
                 super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,"Pass ",5);
    std::ostream::operator<<((ostringstream *)&local_2d8,(int)uVar23);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,": Drawing tiles with the shader.\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,"\tVarying u_special for each tile.\n",0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_2d8,"\tVarying blend function and blend equation for each tile.\n",
               0x3a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_2e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_450 = uVar23;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
    std::ios_base::~ios_base(local_268);
    local_480 = 0;
    local_478 = __s_00;
    do {
      pGVar20 = testFBO::equations;
      uVar23 = 0;
      local_448 = local_478;
      do {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar23;
        uVar1 = *(undefined4 *)
                 ((long)pGVar20 +
                 (SUB168(auVar3 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
        uVar2 = *(undefined4 *)
                 ((long)testFBO::functions +
                 (ulong)((uint)((uVar23 & 0xffffffff) * 0xcccccccd >> 0x20) & 0xfffffffc));
        local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
        local_440 = uVar23;
        local_438 = pGVar20;
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)local_160,testFBO::functions,(uint *)&DAT_01c6acd8,(uint *)local_2e0,1)
        ;
        auVar8 = local_2e0;
        local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)local_160,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_2e0,1);
        auVar9 = local_2e0;
        local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)local_160,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_2e0,1);
        uVar6 = local_2e0._0_4_;
        local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)local_160,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_2e0,1);
        uVar7 = local_2e0._0_4_;
        local_2e0 = (undefined1  [8])((ulong)local_2e0 & 0xffffffff00000000);
        de::Random::choose<unsigned_int_const*,unsigned_int*>
                  ((Random *)local_160,&Stress::(anonymous_namespace)::s_specialFloats,
                   (uint *)"N4deqp5gles36Stress12_GLOBAL__N_111UniformCaseE",(uint *)local_2e0,1);
        TVar5.type = uVar6;
        TVar5.order = auVar9._0_4_;
        local_2d8 = uVar7;
        local_2d4 = local_2e0._0_4_;
        local_2e0 = (undefined1  [8])TVar5;
        (**(code **)(lVar13 + 0x15a8))(uColorLoc,1,(MessageBuilder *)local_2e0);
        (**(code **)(lVar13 + 0x100))(uVar1);
        (**(code **)(lVar13 + 0x120))(uVar2,(ulong)auVar8 & 0xffffffff);
        (**(code **)(lVar13 + 0x568))(4,6,0x1403,local_478);
        uVar23 = local_440 + 1;
        local_478 = (void *)((long)local_478 + 0xc);
        pGVar20 = local_438 + 1;
      } while (uVar23 != 0x1e);
      local_480 = local_480 + 1;
      local_478 = (void *)((long)local_448 + 0x168);
    } while (local_480 != 0x16);
    uVar26 = (int)local_450 + 1;
    uVar23 = (ulong)uVar26;
  } while (uVar26 != 5);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"special passes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x7b0);
  local_2e0 = (undefined1  [8])
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d8,"Drawing post-draw pattern.",0x1a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  tcu::TextureLevel::getAccess(&local_80,&local_308);
  drawTestImage(this,&local_80,uColorLoc,0x2c8);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"post-draw pattern",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x7b5);
  (**(code **)(lVar13 + 0x518))(uVar11);
  (**(code **)(lVar13 + 0x1680))(0);
  dVar12 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar12,"OutputCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sSpecialFloatTests.cpp"
                  ,0x7b9);
  tcu::Surface::Surface(&local_360,0x100,0x100);
  local_2e0 = (undefined1  [8])
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d8,"Checking patterns are identical.",0x20);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  if (local_430.m_size.m_data[1] < 1) {
    iVar10 = 0;
  }
  else {
    z = 0;
    iVar10 = 0;
    do {
      if (0 < local_430.m_size.m_data[0]) {
        y = 0;
        do {
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2e0,&local_430);
          x_00 = (int)(PixelBufferAccess *)local_2e0;
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_160,x_00,y,z);
          tcu::TextureLevel::getAccess((PixelBufferAccess *)local_2e0,&local_308);
          tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_348,x_00,y,z);
          if (((float)local_160 != (float)local_348) ||
             (NAN((float)local_160) || NAN((float)local_348))) {
LAB_013b64eb:
            iVar10 = iVar10 + 1;
            uVar11 = 0xff0000ff;
          }
          else {
            uVar23 = 0xffffffffffffffff;
            while (uVar23 != 2) {
              lVar13 = uVar23 + 1;
              uVar17 = uVar23 + 1;
              lVar16 = uVar23 + 1;
              if ((afStack_15c[lVar13] != afStack_344[lVar16]) ||
                 (uVar23 = uVar17, NAN(afStack_15c[lVar13]) || NAN(afStack_344[lVar16])))
              goto LAB_013b64e0;
            }
            uVar17 = 3;
LAB_013b64e0:
            uVar11 = 0xff00ff00;
            if (uVar17 < 3) goto LAB_013b64eb;
          }
          *(undefined4 *)((long)local_360.m_pixels.m_ptr + (long)(local_360.m_width * z + y) * 4) =
               uVar11;
          y = y + 1;
        } while (y < local_430.m_size.m_data[0]);
      }
      z = z + 1;
    } while (z < local_430.m_size.m_data[1]);
  }
  local_2e0 = (undefined1  [8])
              ((this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_2d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2d8,"Found ",6);
  std::ostream::operator<<((ostringstream *)&local_2d8,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2d8," invalid pixel(s).",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2e0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_2d8);
  std::ios_base::~ios_base(local_268);
  this_01 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
            super_TestNode.m_testCtx;
  if (iVar10 == 0) {
    testResult = QP_TEST_RESULT_PASS;
    description = "Pass";
  }
  else {
    this_00 = this_01->m_log;
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"Results","");
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Result verification","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)local_348,&local_470,&local_380);
    tcu::TestLog::startImageSet(this_00,(char *)CONCAT44(afStack_344[0],local_348),local_328._M_p);
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3a0,"Pattern drawn before special float blending","");
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3c0,"Pattern drawn before special float blending","");
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_a8,&local_430);
    pCVar18 = &local_a8;
    tcu::LogImage::LogImage
              ((LogImage *)local_2e0,&local_3a0,&local_3c0,pCVar18,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2e0,(int)this_00,__buf,(size_t)pCVar18);
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3e0,"Pattern drawn after special float blending","");
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_400,"Pattern drawn after special float blending","");
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_d0,&local_308);
    pCVar18 = &local_d0;
    tcu::LogImage::LogImage
              ((LogImage *)local_160,&local_3e0,&local_400,pCVar18,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_160,(int)this_00,__buf_00,(size_t)pCVar18);
    tcu::TestLog::endImageSet(this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_p != local_130) {
      operator_delete(local_140._M_p,local_130[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(afStack_15c[0],local_160) != &local_150) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(afStack_15c[0],local_160),local_150._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_p != local_2b0) {
      operator_delete(local_2c0._M_p,local_2b0[0]._M_allocated_capacity + 1);
    }
    if (local_2e0 != (undefined1  [8])&local_2d0) {
      operator_delete((void *)local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_p != &local_318) {
      operator_delete(local_328._M_p,local_318._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(afStack_344[0],local_348) != &local_338) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(afStack_344[0],local_348),local_338._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    this_01 = (this->super_FramebufferRenderCase).super_RenderCase.super_TestCase.super_TestCase.
              super_TestNode.m_testCtx;
    description = "Image comparison failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  tcu::Surface::~Surface(&local_360);
  tcu::TextureLevel::~TextureLevel(&local_308);
  tcu::TextureLevel::~TextureLevel(&local_430);
  operator_delete(__s_00,0x1ef0);
  operator_delete(__s,0x2c90);
  return;
}

Assistant:

void BlendingCase::testFBO (void)
{
	static const GLenum equations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};
	static const GLenum functions[] =
	{
		GL_ZERO,
		GL_ONE,
		GL_SRC_COLOR,
		GL_ONE_MINUS_SRC_COLOR,
		GL_SRC_ALPHA,
		GL_ONE_MINUS_SRC_ALPHA,
	};

	// Create a [BlendFuncs] X [s_specialFloats] grid of tiles. ( BlendFuncs = equations x functions )

	const int						numBlendFuncs	= DE_LENGTH_OF_ARRAY(equations) * DE_LENGTH_OF_ARRAY(functions);
	std::vector<tcu::Vec4>			gridVertices	((numBlendFuncs + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>			indices			(numBlendFuncs * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::TextureFormat				textureFormat	(tcu::TextureFormat::RGBA, (m_fboType == FBO_RGBA_FLOAT16 || m_fboType == FBO_RGBA_FLOAT32) ? (tcu::TextureFormat::FLOAT) : (tcu::TextureFormat::UNORM_INT8));
	tcu::TextureLevel				beforeImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
	tcu::TextureLevel				afterImage		(textureFormat, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < numBlendFuncs + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats)] to [-1, 1]
		const float		posY	= (float)y / (float)numBlendFuncs * 2.0f - 1.0f;

		gridVertices[x * (numBlendFuncs + 1) + y]	= tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < numBlendFuncs; ++y)
	{
		const int baseNdx = (x * numBlendFuncs + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (numBlendFuncs + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (numBlendFuncs + 1) + (y+1));
	}

	// Draw tiles
	{
		const int				numPasses	= 5;
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());
		gl.enable(GL_BLEND);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw");

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		// draw "before" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing pre-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(beforeImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "pre-draw pattern");

		// draw multiple passes with special floats
		gl.clear(GL_COLOR_BUFFER_BIT);
		for (int passNdx = 0; passNdx < numPasses; ++passNdx)
		{
			de::Random rnd(123 + 567 * passNdx);

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Pass " << passNdx << ": Drawing tiles with the shader.\n"
				<< "\tVarying u_special for each tile.\n"
				<< "\tVarying blend function and blend equation for each tile.\n"
				<< tcu::TestLog::EndMessage;

			// draw tiles
			for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
			for (int y = 0; y < numBlendFuncs; ++y)
			{
				const GLenum		blendEquation		= equations[y % DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunction		= functions[y / DE_LENGTH_OF_ARRAY(equations)];
				const GLenum		blendFunctionDst	= rnd.choose<GLenum>(DE_ARRAY_BEGIN(functions), DE_ARRAY_END(functions));
				const int			indexIndex			= (x * numBlendFuncs + y) * 6;

				// "rnd.get"s are run in a deterministic order
				const deUint32		componentR			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentG			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentB			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const deUint32		componentA			= rnd.choose<deUint32>(DE_ARRAY_BEGIN(s_specialFloats), DE_ARRAY_END(s_specialFloats));
				const tcu::UVec4	uniformValue		= tcu::UVec4(componentR, componentG, componentB, componentA);

				gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
				gl.blendEquation(blendEquation);
				gl.blendFunc(blendFunction, blendFunctionDst);
				gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
			}
		}
		GLU_EXPECT_NO_ERROR(gl.getError(), "special passes");

		// draw "after" image
		m_testCtx.getLog() << tcu::TestLog::Message << "Drawing post-draw pattern." << tcu::TestLog::EndMessage;
		drawTestImage(afterImage.getAccess(), specialLoc, (int)gridVertices.size() - 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw pattern");

		gl.disableVertexAttribArray(positionLoc);
		gl.useProgram(0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "OutputCase::iterate");
	}

	// Check results
	{
		tcu::Surface		errorMask		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		const tcu::RGBA		badPixelColor	= tcu::RGBA::red();
		const tcu::RGBA		okPixelColor	= tcu::RGBA::green();
		int					badPixels		= 0;

		m_testCtx.getLog() << tcu::TestLog::Message << "Checking patterns are identical." << tcu::TestLog::EndMessage;

		for (int y = 0; y < beforeImage.getHeight(); ++y)
		for (int x = 0; x < beforeImage.getWidth(); ++x)
		{
			const tcu::Vec4	cBefore	= beforeImage.getAccess().getPixel(x, y);
			const tcu::Vec4	cAfter	= afterImage.getAccess().getPixel(x, y);

			if (cBefore != cAfter)
			{
				++badPixels;
				errorMask.setPixel(x, y, badPixelColor);
			}
			else
				errorMask.setPixel(x, y, okPixelColor);
		}

		m_testCtx.getLog() << tcu::TestLog::Message << "Found " << badPixels << " invalid pixel(s)." << tcu::TestLog::EndMessage;

		if (badPixels)
		{
			m_testCtx.getLog()
					<< tcu::TestLog::ImageSet("Results", "Result verification")
					<< tcu::TestLog::Image("Pattern drawn before special float blending",	"Pattern drawn before special float blending",		beforeImage)
					<< tcu::TestLog::Image("Pattern drawn after special float blending",	"Pattern drawn after special float blending",		afterImage)
					<< tcu::TestLog::EndImageSet;

			// all ok?
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
}